

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_fragmented_message(void)

{
  int iVar1;
  undefined1 auStack_238 [4];
  int ret;
  st_ptls_record_t rec;
  ptls_t tls;
  
  memset(&rec.fragment,0,0x218);
  auStack_238[0] = '\x16';
  auStack_238[1] = 0;
  auStack_238._2_2_ = 0x301;
  ret = 0;
  test_fragmented_message_queue.count = 0;
  rec.type = '\a';
  rec._1_1_ = 0;
  rec.version = 0;
  rec._4_4_ = 0;
  rec.length = (size_t)anon_var_dwarf_bcd1;
  iVar1 = handle_handshake_record
                    ((ptls_t *)&rec.fragment,test_fragmented_message_record,
                     (ptls_message_emitter_t *)0x0,(st_ptls_record_t *)auStack_238,
                     (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1cf);
  _ok((uint)(test_fragmented_message_queue.count == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d0);
  _ok((uint)(test_fragmented_message_queue.vec[0].len == rec._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d1);
  iVar1 = memcmp(&test_fragmented_message_queue,(void *)rec.length,rec._0_8_);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d2);
  _ok(test_fragmented_message_queue.vec[0].is_end_of_record,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d3);
  _ok((uint)(tls.recvbuf.rec._24_8_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d4);
  test_fragmented_message_queue.count = 0;
  rec.type = '\x05';
  rec._1_1_ = 0;
  rec.version = 0;
  rec._4_4_ = 0;
  rec.length = (size_t)anon_var_dwarf_bcdd;
  iVar1 = handle_handshake_record
                    ((ptls_t *)&rec.fragment,test_fragmented_message_record,
                     (ptls_message_emitter_t *)0x0,(st_ptls_record_t *)auStack_238,
                     (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1db);
  _ok((uint)(tls.recvbuf.rec._24_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1dc);
  _ok((uint)(test_fragmented_message_queue.count == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1dd);
  rec.type = '\t';
  rec._1_1_ = 0;
  rec.version = 0;
  rec._4_4_ = 0;
  rec.length = (size_t)anon_var_dwarf_bce9;
  iVar1 = handle_handshake_record
                    ((ptls_t *)&rec.fragment,test_fragmented_message_record,
                     (ptls_message_emitter_t *)0x0,(st_ptls_record_t *)auStack_238,
                     (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e2);
  _ok((uint)(test_fragmented_message_queue.count == 2),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e3);
  _ok((uint)(test_fragmented_message_queue.vec[0].len == 7),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e4);
  iVar1 = memcmp(&test_fragmented_message_queue,"\x01",7);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e8);
  _ok((uint)((test_fragmented_message_queue.vec[0].is_end_of_record != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e9);
  _ok((uint)(test_fragmented_message_queue.vec[1].len == 6),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ea);
  iVar1 = memcmp(test_fragmented_message_queue.vec + 1,"\x02",6);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ee);
  _ok((uint)((test_fragmented_message_queue.vec[1].is_end_of_record != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ef);
  rec.type = '\x06';
  rec._1_1_ = 0;
  rec.version = 0;
  rec._4_4_ = 0;
  rec.length = (size_t)anon_var_dwarf_bd01;
  iVar1 = handle_handshake_record
                    ((ptls_t *)&rec.fragment,test_fragmented_message_record,
                     (ptls_message_emitter_t *)0x0,(st_ptls_record_t *)auStack_238,
                     (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",499);
  _ok((uint)(tls.recvbuf.rec._24_8_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",500);
  _ok((uint)(test_fragmented_message_queue.count == 3),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1f5);
  _ok((uint)(test_fragmented_message_queue.vec[2].len == 7),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1f6);
  iVar1 = memcmp(test_fragmented_message_queue.vec + 2,"\x03",7);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1fa);
  _ok(test_fragmented_message_queue.vec[2].is_end_of_record,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1fb);
  return;
}

Assistant:

static void test_fragmented_message(void)
{
    ptls_t tls = {NULL};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0x0301};
    int ret;

#define SET_RECORD(lit)                                                                                                            \
    do {                                                                                                                           \
        rec.length = sizeof(lit) - 1;                                                                                              \
        rec.fragment = (const uint8_t *)(lit);                                                                                     \
    } while (0)

    /* not fragmented */
    test_fragmented_message_queue.count = 0;
    SET_RECORD("\x01\x00\x00\x03"
               "abc");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == 0);
    ok(test_fragmented_message_queue.count == 1);
    ok(test_fragmented_message_queue.vec[0].len == rec.length);
    ok(memcmp(test_fragmented_message_queue.vec[0].buf, rec.fragment, rec.length) == 0);
    ok(test_fragmented_message_queue.vec[0].is_end_of_record);
    ok(tls.recvbuf.mess.base == NULL);

    /* fragmented */
    test_fragmented_message_queue.count = 0;
    SET_RECORD("\x01\x00\x00\x03"
               "a");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(tls.recvbuf.mess.base != NULL);
    ok(test_fragmented_message_queue.count == 0);
    SET_RECORD("bc\x02\x00\x00\x02"
               "de"
               "\x03");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(test_fragmented_message_queue.count == 2);
    ok(test_fragmented_message_queue.vec[0].len == 7);
    ok(memcmp(test_fragmented_message_queue.vec[0].buf,
              "\x01\x00\x00\x03"
              "abc",
              7) == 0);
    ok(!test_fragmented_message_queue.vec[0].is_end_of_record);
    ok(test_fragmented_message_queue.vec[1].len == 6);
    ok(memcmp(test_fragmented_message_queue.vec[1].buf,
              "\x02\x00\x00\x02"
              "de",
              6) == 0);
    ok(!test_fragmented_message_queue.vec[1].is_end_of_record);
    SET_RECORD("\x00\x00\x03"
               "end");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == 0);
    ok(tls.recvbuf.mess.base == NULL);
    ok(test_fragmented_message_queue.count == 3);
    ok(test_fragmented_message_queue.vec[2].len == 7);
    ok(memcmp(test_fragmented_message_queue.vec[2].buf,
              "\x03\x00\x00\x03"
              "end",
              7) == 0);
    ok(test_fragmented_message_queue.vec[2].is_end_of_record);

#undef SET_RECORD
}